

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O1

void __thiscall
RandomTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_>::RandomTestData
          (RandomTestData<char32_t,_std::vector<char32_t,_std::allocator<char32_t>_>_> *this,
          char32_t in_delim,size_t in_fixed_word_count,size_t in_fixed_word_length)

{
  char32_t local_1c;
  
  (this->m_delim).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_delim).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_delim).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_fixed_word_count = in_fixed_word_count;
  this->m_fixed_word_length = in_fixed_word_length;
  (this->m_str).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_str).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_str).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_tokens).
  super__Vector_base<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tokens).
  super__Vector_base<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tokens).
  super__Vector_base<std::vector<char32_t,_std::allocator<char32_t>_>,_std::allocator<std::vector<char32_t,_std::allocator<char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c = in_delim;
  std::vector<char32_t,_std::allocator<char32_t>_>::insert
            (&this->m_delim,
             (const_iterator)
             (this->m_delim).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_1c);
  populate(this);
  return;
}

Assistant:

RandomTestData(T in_delim = default_delim<T>, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		m_delim.insert(m_delim.end(), in_delim);
		populate();
	}